

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcEdgeLogDerivativesPartials
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *postOrderPartial,float *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          float *categoryWeights,int scalingFactorsIndex,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  float fVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float weight;
  int v;
  int l;
  int w;
  float *transMatrix;
  undefined4 local_84;
  float sum13;
  float sum12;
  float sum11;
  float sum10;
  float p03;
  float p02;
  float p01;
  float p00;
  float p13;
  float p12;
  float p11;
  float p10;
  int k;
  float m133;
  float m132;
  float m131;
  float m130;
  float m123;
  float m122;
  float m121;
  float m120;
  float m113;
  float m112;
  float m111;
  float m110;
  float m103;
  float m102;
  float m101;
  float m100;
  
  lVar26 = *(long *)(*(long *)(in_RDI + 0xd0) + (long)in_ECX * 8);
  m130 = 0.0;
  for (m131 = 0.0; (int)m131 < *(int *)(in_RDI + 0x34); m131 = (float)((int)m131 + 1)) {
    m132 = (float)((int)m131 * *(int *)(in_RDI + 0x18) * 4);
    uVar1 = *(uint *)(_l + (long)(int)m131 * 4);
    uVar2 = *(uint *)(lVar26 + (long)(int)m130 * 4);
    fVar3 = *(float *)(lVar26 + (long)((int)m130 + 1) * 4);
    uVar4 = *(uint *)(lVar26 + (long)((int)m130 + 2) * 4);
    uVar5 = *(uint *)(lVar26 + (long)((int)m130 + 3) * 4);
    uVar6 = *(uint *)(lVar26 + (long)((int)m130 + 5) * 4);
    fVar7 = *(float *)(lVar26 + (long)((int)m130 + 6) * 4);
    uVar8 = *(uint *)(lVar26 + (long)((int)m130 + 7) * 4);
    uVar9 = *(uint *)(lVar26 + (long)((int)m130 + 8) * 4);
    uVar10 = *(uint *)(lVar26 + (long)((int)m130 + 10) * 4);
    fVar11 = *(float *)(lVar26 + (long)((int)m130 + 0xb) * 4);
    uVar12 = *(uint *)(lVar26 + (long)((int)m130 + 0xc) * 4);
    uVar13 = *(uint *)(lVar26 + (long)((int)m130 + 0xd) * 4);
    uVar14 = *(uint *)(lVar26 + (long)((int)m130 + 0xf) * 4);
    fVar15 = *(float *)(lVar26 + (long)((int)m130 + 0x10) * 4);
    uVar16 = *(uint *)(lVar26 + (long)((int)m130 + 0x11) * 4);
    uVar17 = *(uint *)(lVar26 + (long)((int)m130 + 0x12) * 4);
    for (local_84 = 0; local_84 < *(int *)(in_RDI + 0x14); local_84 = local_84 + 1) {
      uVar18 = *(uint *)(in_RSI + (long)(int)m132 * 4);
      fVar19 = *(float *)(in_RSI + (long)((int)m132 + 1) * 4);
      uVar20 = *(uint *)(in_RSI + (long)((int)m132 + 2) * 4);
      uVar21 = *(uint *)(in_RSI + (long)((int)m132 + 3) * 4);
      uVar22 = *(uint *)(in_RDX + (long)(int)m132 * 4);
      fVar23 = *(float *)(in_RDX + (long)((int)m132 + 1) * 4);
      uVar24 = *(uint *)(in_RDX + (long)((int)m132 + 2) * 4);
      uVar25 = *(uint *)(in_RDX + (long)((int)m132 + 3) * 4);
      auVar27 = vfmadd213ss_fma(ZEXT416(uVar18),ZEXT416(uVar2),ZEXT416((uint)(fVar3 * fVar19)));
      auVar27 = vfmadd213ss_fma(ZEXT416(uVar20),ZEXT416(uVar4),auVar27);
      auVar27 = vfmadd213ss_fma(ZEXT416(uVar21),ZEXT416(uVar5),auVar27);
      auVar28 = vfmadd213ss_fma(ZEXT416(uVar18),ZEXT416(uVar6),ZEXT416((uint)(fVar7 * fVar19)));
      auVar28 = vfmadd213ss_fma(ZEXT416(uVar20),ZEXT416(uVar8),auVar28);
      auVar28 = vfmadd213ss_fma(ZEXT416(uVar21),ZEXT416(uVar9),auVar28);
      auVar29 = vfmadd213ss_fma(ZEXT416(uVar18),ZEXT416(uVar10),ZEXT416((uint)(fVar11 * fVar19)));
      auVar29 = vfmadd213ss_fma(ZEXT416(uVar20),ZEXT416(uVar12),auVar29);
      auVar29 = vfmadd213ss_fma(ZEXT416(uVar21),ZEXT416(uVar13),auVar29);
      auVar30 = vfmadd213ss_fma(ZEXT416(uVar18),ZEXT416(uVar14),ZEXT416((uint)(fVar15 * fVar19)));
      auVar30 = vfmadd213ss_fma(ZEXT416(uVar20),ZEXT416(uVar16),auVar30);
      auVar30 = vfmadd213ss_fma(ZEXT416(uVar21),ZEXT416(uVar17),auVar30);
      auVar31 = vfmadd213ss_fma(ZEXT416(uVar22),ZEXT416(uVar18),ZEXT416((uint)(fVar19 * fVar23)));
      auVar31 = vfmadd213ss_fma(ZEXT416(uVar24),ZEXT416(uVar20),auVar31);
      auVar31 = vfmadd213ss_fma(ZEXT416(uVar25),ZEXT416(uVar21),auVar31);
      auVar31 = vfmadd213ss_fma(ZEXT416(uVar1),auVar31,
                                ZEXT416(*(uint *)(*(long *)(in_RDI + 0xf0) + (long)local_84 * 4)));
      *(int *)(*(long *)(in_RDI + 0xf0) + (long)local_84 * 4) = auVar31._0_4_;
      auVar27 = vfmadd213ss_fma(ZEXT416(uVar22),ZEXT416(auVar27._0_4_),
                                ZEXT416((uint)(auVar28._0_4_ * fVar23)));
      auVar27 = vfmadd213ss_fma(ZEXT416(uVar24),ZEXT416(auVar29._0_4_),auVar27);
      auVar27 = vfmadd213ss_fma(ZEXT416(uVar25),ZEXT416(auVar30._0_4_),auVar27);
      auVar27 = vfmadd213ss_fma(ZEXT416(uVar1),auVar27,
                                ZEXT416(*(uint *)(*(long *)(in_RDI + 0xf8) + (long)local_84 * 4)));
      *(int *)(*(long *)(in_RDI + 0xf8) + (long)local_84 * 4) = auVar27._0_4_;
      m132 = (float)((int)m132 + 4);
    }
    m130 = (float)((int)m130 + 0x14);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesPartials(const REALTYPE *postOrderPartial,
                                                                             const REALTYPE *preOrderPartial,
                                                                             const int firstDerivativeIndex,
                                                                             const int secondDerivativeIndex,
                                                                             const double *categoryRates,
                                                                             const REALTYPE *categoryWeights,
                                                                             const int scalingFactorsIndex,
                                                                             double *outDerivatives,
                                                                             double *outSumDerivatives,
                                                                             double *outSumSquaredDerivatives) {

    const REALTYPE* transMatrix = gTransitionMatrices[firstDerivativeIndex];

    int w = 0;
    for(int l = 0; l < kCategoryCount; l++) {

        int v = l*kPaddedPatternCount*4;

        const REALTYPE weight = categoryWeights[l];

        PREFETCH_MATRIX(1,transMatrix,w); // TODO Use _TRANSPOSE and then reverse integration below

        for(int k = 0; k < kPatternCount; k++) {

            PREFETCH_PARTIALS(1, postOrderPartial,v);
            PREFETCH_PARTIALS(0, preOrderPartial, v);


            DO_INTEGRATION(1);

//            grandNumeratorDerivTmp[k] += (sum10 * prePartials[v] + sum11 * prePartials[v + 1]
//                    + sum12 * prePartials[v + 2] + sum13 * prePartials[v + 3]) * weight;
//            grandDenominatorDerivTmp[k] += (postPartials[v] * prePartials[v] + postPartials[v + 1] * prePartials[v + 1]
//                    + postPartials[v + 2] * prePartials[v + 2] + postPartials[v + 3] * prePartials[v + 3]) * weight;

            grandDenominatorDerivTmp[k] += (p10 * p00 + p11 * p01 + p12 * p02 + p13 * p03) * weight;
            grandNumeratorDerivTmp[k] += (sum10 * p00 + sum11 * p01 + sum12 * p02 + sum13 * p03) * weight;

            v += 4;
        }
        w += OFFSET*4;
    }
}